

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

Program * __thiscall soul::Program::operator=(Program *this,Program *param_1)

{
  this->pimpl = param_1->pimpl;
  RefCountedPtr<soul::Program::ProgramImpl>::operator=(&this->refHolder,&param_1->refHolder);
  return this;
}

Assistant:

Program Program::createFromHEART (CompileMessageList& messageList, CodeLocation heartCode)
{
    try
    {
        CompileMessageHandler handler (messageList);
        auto program = heart::Parser::parse (std::move (heartCode));
        heart::Checker::sanityCheck (program);
        return program;
    }
    catch (AbortCompilationException) {}

    return {};
}